

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactStateMachine.cpp
# Opt level: O3

void __thiscall
iDynTree::ContactStateMachine::contactMeasurementUpdate
          (ContactStateMachine *this,double currentTime,double contactNormalForce)

{
  SchmittTrigger::updateDevice
            ((this->m_contactSchmitt)._M_t.
             super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
             ._M_t.
             super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
             .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl,currentTime,
             contactNormalForce);
  this->m_previousState = this->m_currentState;
  this->m_currentState =
       ((this->m_contactSchmitt)._M_t.
        super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
        ._M_t.
        super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
        .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl)->m_currentState;
  return;
}

Assistant:

void ContactStateMachine::contactMeasurementUpdate(double currentTime, double contactNormalForce)
{
    m_contactSchmitt.get()->updateDevice(currentTime, contactNormalForce);
    m_previousState = m_currentState;
    m_currentState = m_contactSchmitt.get()->getState();
}